

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

bool __thiscall
xatlas::internal::segment::Atlas::computeChartBasis(Atlas *this,Chart *chart,Basis *basis)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Mesh *pMVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  
  uVar2 = (chart->faces).m_base.size;
  uVar9 = uVar2 * 3;
  (this->m_tempPoints).m_base.size = uVar9;
  if ((this->m_tempPoints).m_base.capacity < uVar9) {
    ArrayBase::setArrayCapacity(&(this->m_tempPoints).m_base,uVar9);
  }
  if (uVar2 != 0) {
    uVar9 = 0;
    uVar10 = 0;
    do {
      if ((chart->faces).m_base.size <= uVar10) {
        pcVar11 = 
        "T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) [T = unsigned int]";
LAB_001af480:
        __assert_fail("index < m_base.size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                      ,0x4ae,pcVar11);
      }
      lVar12 = (ulong)uVar9 * 0xc;
      iVar3 = *(int *)((chart->faces).m_base.buffer + (ulong)uVar10 * 4);
      lVar13 = 0;
      do {
        pMVar5 = this->m_mesh;
        uVar1 = (ulong)(uint)(iVar3 * 3) + lVar13;
        if ((pMVar5->m_indices).m_base.size <= (uint)uVar1) {
          pcVar11 = 
          "const T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) const [T = unsigned int]"
          ;
LAB_001af461:
          __assert_fail("index < m_base.size",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                        ,0x4a8,pcVar11);
        }
        uVar4 = *(uint *)((pMVar5->m_indices).m_base.buffer + (uVar1 & 0xffffffff) * 4);
        if ((pMVar5->m_positions).m_base.size <= uVar4) {
          pcVar11 = 
          "const T &xatlas::internal::Array<xatlas::internal::Vector3>::operator[](uint32_t) const [T = xatlas::internal::Vector3]"
          ;
          goto LAB_001af461;
        }
        if ((ulong)(this->m_tempPoints).m_base.size <= (ulong)uVar9 + lVar13) {
          pcVar11 = 
          "T &xatlas::internal::Array<xatlas::internal::Vector3>::operator[](uint32_t) [T = xatlas::internal::Vector3]"
          ;
          goto LAB_001af480;
        }
        puVar6 = (pMVar5->m_positions).m_base.buffer;
        puVar7 = (this->m_tempPoints).m_base.buffer;
        *(undefined4 *)(puVar7 + lVar12 + 8) = *(undefined4 *)(puVar6 + (ulong)uVar4 * 0xc + 8);
        *(undefined8 *)(puVar7 + lVar12) = *(undefined8 *)(puVar6 + (ulong)uVar4 * 0xc);
        lVar13 = lVar13 + 1;
        lVar12 = lVar12 + 0xc;
      } while (lVar13 != 3);
      uVar10 = uVar10 + 1;
      uVar9 = uVar9 + 3;
    } while (uVar10 != uVar2);
  }
  bVar8 = Fit::computeBasis((Vector3 *)(this->m_tempPoints).m_base.buffer,
                            (this->m_tempPoints).m_base.size,basis);
  return bVar8;
}

Assistant:

bool computeChartBasis(Chart *chart, Basis *basis)
	{
		const uint32_t faceCount = chart->faces.size();
		m_tempPoints.resize(chart->faces.size() * 3);
		for (uint32_t i = 0; i < faceCount; i++) {
			const uint32_t f = chart->faces[i];
			for (uint32_t j = 0; j < 3; j++)
				m_tempPoints[i * 3 + j] = m_mesh->position(m_mesh->vertexAt(f * 3 + j));
		}
		return Fit::computeBasis(m_tempPoints.data(), m_tempPoints.size(), basis);
	}